

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O3

block * __thiscall storage::get(block *__return_storage_ptr__,storage *this,bool *ok,uint64_t idx)

{
  uint64_t uVar1;
  uint64_t uVar2;
  bool bVar3;
  undefined1 auStack_b8 [8];
  block b;
  
  __return_storage_ptr__->idx = 0;
  __return_storage_ptr__->timestamp = 0;
  (__return_storage_ptr__->prevsha256)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->prevsha256).field_2;
  (__return_storage_ptr__->prevsha256)._M_string_length = 0;
  (__return_storage_ptr__->prevsha256).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->data)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->data).field_2
  ;
  (__return_storage_ptr__->data)._M_string_length = 0;
  (__return_storage_ptr__->data).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->sha256)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->sha256).field_2;
  (__return_storage_ptr__->sha256)._M_string_length = 0;
  (__return_storage_ptr__->sha256).field_2._M_local_buf[0] = '\0';
  uVar1 = fsize(this);
  if (uVar1 != 0) {
    fseek((FILE *)this->m_file,0,0);
    read_block((block *)auStack_b8,this);
    b.sha256.field_2._8_8_ = &__return_storage_ptr__->prevsha256;
    __return_storage_ptr__->idx = (uint64_t)auStack_b8;
    __return_storage_ptr__->timestamp = b.idx;
    std::__cxx11::string::operator=((string *)b.sha256.field_2._8_8_,(string *)&b.timestamp);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->data,
               (string *)(b.prevsha256.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->sha256,(string *)(b.data.field_2._M_local_buf + 8)
              );
    if ((size_type *)b.data.field_2._8_8_ != &b.sha256._M_string_length) {
      operator_delete((void *)b.data.field_2._8_8_);
    }
    if ((size_type *)b.prevsha256.field_2._8_8_ != &b.data._M_string_length) {
      operator_delete((void *)b.prevsha256.field_2._8_8_);
    }
    while( true ) {
      if ((size_type *)b.timestamp != &b.prevsha256._M_string_length) {
        operator_delete((void *)b.timestamp);
      }
      if (__return_storage_ptr__->idx == idx) {
        bVar3 = true;
        goto LAB_001045b1;
      }
      uVar1 = fsize(this);
      uVar2 = ftell((FILE *)this->m_file);
      if (uVar1 == uVar2) break;
      read_block((block *)auStack_b8,this);
      __return_storage_ptr__->idx = (uint64_t)auStack_b8;
      __return_storage_ptr__->timestamp = b.idx;
      std::__cxx11::string::operator=((string *)b.sha256.field_2._8_8_,(string *)&b.timestamp);
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->data,
                 (string *)(b.prevsha256.field_2._M_local_buf + 8));
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->sha256,
                 (string *)(b.data.field_2._M_local_buf + 8));
      if ((size_type *)b.data.field_2._8_8_ != &b.sha256._M_string_length) {
        operator_delete((void *)b.data.field_2._8_8_);
      }
      if ((size_type *)b.prevsha256.field_2._8_8_ != &b.data._M_string_length) {
        operator_delete((void *)b.prevsha256.field_2._8_8_);
      }
    }
  }
  bVar3 = false;
LAB_001045b1:
  *ok = bVar3;
  return __return_storage_ptr__;
}

Assistant:

block get(bool *ok, std::uint64_t idx) {
        block b{};
        if ( empty() ) {
            *ok = false;
            return b;
        }

        for ( b = first(); ; b = next() ) {
            if ( b.idx == idx ) {
                *ok = true;
                return b;
            }

            if ( at_end() ) {
                break;
            }
        }

        *ok = false;

        return b;
    }